

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<const_QGraphicsItem_*,_QMap<int,_QVariant>_>_>::Data
          (Data<QHashPrivate::Node<const_QGraphicsItem_*,_QMap<int,_QVariant>_>_> *this,
          Data<QHashPrivate::Node<const_QGraphicsItem_*,_QMap<int,_QVariant>_>_> *other,
          size_t reserved)

{
  byte bVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar5;
  Node<const_QGraphicsItem_*,_QMap<int,_QVariant>_> *pNVar6;
  long lVar7;
  ulong uVar8;
  size_t numBuckets;
  long lVar9;
  long in_FS_OFFSET;
  R RVar10;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar2 = other->size;
  this->size = uVar2;
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  if (reserved < uVar2) {
    reserved = uVar2;
  }
  numBuckets = 0x80;
  if (0x40 < reserved) {
    if (reserved >> 0x3e == 0) {
      lVar7 = 0x3f;
      if (reserved != 0) {
        for (; reserved >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar7 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  this->numBuckets = numBuckets;
  RVar10 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar10.spans;
  uVar2 = other->numBuckets;
  lVar7 = 0;
  for (uVar8 = 0; uVar8 != uVar2 >> 7; uVar8 = uVar8 + 1) {
    pSVar3 = other->spans;
    for (lVar9 = 0; lVar9 != 0x80; lVar9 = lVar9 + 1) {
      bVar1 = pSVar3->offsets[lVar9 + lVar7];
      if (bVar1 != 0xff) {
        pEVar4 = pSVar3[uVar8].entries;
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = Data<QHashPrivate::Node<QGraphicsItem_const*,QMap<int,QVariant>>>::
                   findBucket<QGraphicsItem_const*>
                             ((Data<QHashPrivate::Node<QGraphicsItem_const*,QMap<int,QVariant>>> *)
                              this,(QGraphicsItem **)(pEVar4 + bVar1));
        pNVar6 = Bucket::insert(&local_48);
        pNVar6->key = *(QGraphicsItem **)pEVar4[bVar1].storage.data;
        pQVar5 = *(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                   **)(pEVar4[bVar1].storage.data + 8);
        (pNVar6->value).d.d.ptr = pQVar5;
        if (pQVar5 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                       *)0x0) {
          LOCK();
          (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value = (Type)((int)(pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.
                                 super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
      }
    }
    lVar7 = lVar7 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }